

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getUniformName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int ndx,VarType *type,
          TypeComponentVector *path)

{
  ostream *poVar1;
  undefined4 in_register_00000014;
  ostringstream buff;
  TypeAccessFormat local_1b0;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"uni");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)this);
  local_1b0.type = (VarType *)CONCAT44(in_register_00000014,ndx);
  local_1b0.path = (TypeComponentVector *)type;
  glu::operator<<(poVar1,&local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string getUniformName (int ndx, const glu::VarType& type, const glu::TypeComponentVector& path)
{
	std::ostringstream buff;
	buff << "uni" << ndx << glu::TypeAccessFormat(type, path);

	return buff.str();
}